

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-bmp.hxx
# Opt level: O2

uint8_t * andres::bmp::infoHeader(uint32_t width,uint32_t height,uint16_t bitsPerPixel)

{
  infoHeader::infoHeader[0] = '(';
  infoHeader::infoHeader[4] = (uint8_t)width;
  infoHeader::infoHeader[5] = (uint8_t)(width >> 8);
  infoHeader::infoHeader[6] = (uint8_t)(width >> 0x10);
  infoHeader::infoHeader[7] = (uint8_t)(width >> 0x18);
  infoHeader::infoHeader[8] = (uint8_t)height;
  infoHeader::infoHeader[9] = (uint8_t)(height >> 8);
  infoHeader::infoHeader[10] = (uint8_t)(height >> 0x10);
  infoHeader::infoHeader[0xb] = (uint8_t)(height >> 0x18);
  infoHeader::infoHeader[0xc] = '\x01';
  infoHeader::infoHeader._14_2_ = bitsPerPixel;
  return infoHeader::infoHeader;
}

Assistant:

std::uint8_t*
infoHeader(
    std::uint32_t const width,
    std::uint32_t const height,
    std::uint16_t const bitsPerPixel
) {
    static std::uint8_t infoHeader[] = {
        0,0,0,0, /// header size
        0,0,0,0, /// image width
        0,0,0,0, /// image height
        0,0,     /// number of color planes
        0,0,     /// bits per pixel
        0,0,0,0, /// compression
        0,0,0,0, /// image size
        0,0,0,0, /// horizontal resolution
        0,0,0,0, /// vertical resolution
        0,0,0,0, /// colors in color table, 0 for 0^bits per pixel
        0,0,0,0, /// important color count, unsused and should be 0
    };

    infoHeader[ 0] = static_cast<std::uint8_t>(INFO_HEADER_SIZE);
    infoHeader[ 4] = static_cast<std::uint8_t>(width      );
    infoHeader[ 5] = static_cast<std::uint8_t>(width >>  8);
    infoHeader[ 6] = static_cast<std::uint8_t>(width >> 16);
    infoHeader[ 7] = static_cast<std::uint8_t>(width >> 24);
    infoHeader[ 8] = static_cast<std::uint8_t>(height      );
    infoHeader[ 9] = static_cast<std::uint8_t>(height >>  8);
    infoHeader[10] = static_cast<std::uint8_t>(height >> 16);
    infoHeader[11] = static_cast<std::uint8_t>(height >> 24);
    infoHeader[12] = static_cast<std::uint8_t>(1);
    infoHeader[14] = static_cast<std::uint8_t>(bitsPerPixel);
    infoHeader[15] = static_cast<std::uint8_t>(bitsPerPixel >> 8);

    return infoHeader;
}